

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsValueRef
WScriptJsrt::RegisterModuleSourceCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  undefined1 auStack_58 [8];
  AutoString fileName;
  AutoString data;
  JsValueRef returnValue;
  
  data.errorCode = JsNoError;
  data.dontFree = false;
  data._29_3_ = 0;
  if (argumentCount < 3) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)((JsValueRef *)&data.errorCode);
  }
  else {
    fileName.data._0_5_ = 0;
    fileName._13_8_ = 0;
    auStack_58 = (undefined1  [8])0x0;
    fileName.length._0_5_ = 0;
    fileName.length._5_3_ = 0;
    data.data._0_5_ = 0;
    data._13_8_ = 0;
    fileName.errorCode = JsNoError;
    fileName.dontFree = false;
    fileName._29_3_ = 0;
    data.length._0_5_ = 0;
    data.length._5_3_ = 0;
    JVar1 = AutoString::Initialize((AutoString *)auStack_58,arguments[1]);
    if (JVar1 == JsNoError) {
      JVar1 = AutoString::Initialize((AutoString *)&fileName.errorCode,arguments[2]);
      if (JVar1 == JsNoError) {
        SourceMap::Add((AutoString *)auStack_58,(AutoString *)&fileName.errorCode);
      }
    }
    AutoString::~AutoString((AutoString *)&fileName.errorCode);
    AutoString::~AutoString((AutoString *)auStack_58);
    data._24_8_ = (JsValueRef)0x0;
  }
  return (JsValueRef)data._24_8_;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::RegisterModuleSourceCallback(JsValueRef callee, bool isConstructCall,
    JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    if (argumentCount < 3)
    {
        IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));
    }
    else
    {
        AutoString fileName;
        AutoString data;
        IfJsrtErrorSetGo(fileName.Initialize(arguments[1]));
        IfJsrtErrorSetGo(data.Initialize(arguments[2]));

        SourceMap::Add(fileName, data);
    }

Error:
    return returnValue;
}